

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

bool __thiscall MT32Emu::Synth::loadPCMROM(Synth *this,ROMImage *pcmROMImage)

{
  size_t sVar1;
  Bit16s *pBVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  File *pFVar6;
  ROMInfo *pRVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *pbVar8;
  byte bVar9;
  size_t sVar10;
  char *pcVar11;
  int u;
  ulong uVar12;
  uint uVar13;
  
  pFVar6 = ROMImage::getFile(pcmROMImage);
  pRVar7 = ROMImage::getROMInfo(pcmROMImage);
  if ((((pRVar7 == (ROMInfo *)0x0) || (pRVar7->type != PCM)) || (pRVar7->pairType != Full)) ||
     (iVar5 = (*pFVar6->_vptr_File[2])(pFVar6), CONCAT44(extraout_var,iVar5) != this->pcmROMSize * 2
     )) {
    bVar4 = false;
  }
  else {
    iVar5 = (*pFVar6->_vptr_File[3])(pFVar6);
    pbVar8 = (byte *)CONCAT44(extraout_var_00,iVar5);
    sVar1 = this->pcmROMSize;
    bVar4 = true;
    if (sVar1 != 0) {
      pBVar2 = this->pcmROMData;
      sVar10 = 0;
      do {
        bVar9 = 0xf;
        uVar12 = 0;
        pcVar11 = "";
        uVar13 = 0;
        do {
          bVar3 = pbVar8[1] >> (0xfU - *pcVar11 & 0x1f);
          if ((0x1fdUL >> (uVar12 & 0x3f) & 1) != 0) {
            bVar3 = *pbVar8 >> (7U - *pcVar11 & 0x1f);
          }
          uVar13 = uVar13 | (bVar3 & 1) << (bVar9 & 0x1f);
          uVar12 = uVar12 + 1;
          bVar9 = bVar9 - 1;
          pcVar11 = pcVar11 + 4;
        } while (uVar12 != 0x10);
        pbVar8 = pbVar8 + 2;
        pBVar2[sVar10] = (Bit16s)uVar13;
        sVar10 = sVar10 + 1;
      } while (sVar10 != sVar1);
    }
  }
  return bVar4;
}

Assistant:

bool Synth::loadPCMROM(const ROMImage &pcmROMImage) {
	File *file = pcmROMImage.getFile();
	const ROMInfo *pcmROMInfo = pcmROMImage.getROMInfo();
	if ((pcmROMInfo == NULL)
			|| (pcmROMInfo->type != ROMInfo::PCM)
			|| (pcmROMInfo->pairType != ROMInfo::Full)) {
		return false;
	}
#if MT32EMU_MONITOR_INIT
	printDebug("Found PCM ROM: %s, %s", pcmROMInfo->shortName, pcmROMInfo->description);
#endif
	size_t fileSize = file->getSize();
	if (fileSize != (2 * pcmROMSize)) {
#if MT32EMU_MONITOR_INIT
		printDebug("PCM ROM file has wrong size (expected %d, got %d)", 2 * pcmROMSize, fileSize);
#endif
		return false;
	}
	const Bit8u *fileData = file->getData();
	for (size_t i = 0; i < pcmROMSize; i++) {
		Bit8u s = *(fileData++);
		Bit8u c = *(fileData++);

		int order[16] = {0, 9, 1, 2, 3, 4, 5, 6, 7, 10, 11, 12, 13, 14, 15, 8};

		Bit16s log = 0;
		for (int u = 0; u < 16; u++) {
			int bit;
			if (order[u] < 8) {
				bit = (s >> (7 - order[u])) & 0x1;
			} else {
				bit = (c >> (7 - (order[u] - 8))) & 0x1;
			}
			log = log | Bit16s(bit << (15 - u));
		}
		pcmROMData[i] = log;
	}
	return true;
}